

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

void __thiscall o3dgc::Adaptive_Data_Model::reset(Adaptive_Data_Model *this)

{
  uint k;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->data_symbols;
  if (uVar1 != 0) {
    this->total_count = 0;
    this->update_cycle = uVar1;
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      this->symbol_count[uVar2] = 1;
      uVar1 = this->data_symbols;
    }
    update(this,false);
    uVar1 = this->data_symbols + 6 >> 1;
    this->update_cycle = uVar1;
    this->symbols_until_update = uVar1;
  }
  return;
}

Assistant:

void Adaptive_Data_Model::reset(void)
    {
      if (data_symbols == 0) return;

                          // restore probability estimates to uniform distribution
      total_count = 0;
      update_cycle = data_symbols;
      for (unsigned k = 0; k < data_symbols; k++) symbol_count[k] = 1;
      update(false);
      symbols_until_update = update_cycle = (data_symbols + 6) >> 1;
    }